

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

uint32 rw::geoStructSize(Geometry *geo)

{
  uint uVar1;
  uint32 uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = 0x10;
  if (version < 0x34000) {
    uVar2 = 0x1c;
  }
  uVar1 = geo->flags;
  if ((uVar1 >> 0x18 & 1) == 0) {
    if ((uVar1 & 8) != 0) {
      uVar2 = uVar2 + geo->numVertices * 4;
    }
    iVar3 = 0;
    if (0 < geo->numTexCoordSets) {
      iVar3 = geo->numTexCoordSets;
    }
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      uVar2 = uVar2 + geo->numVertices * 8;
    }
    uVar2 = uVar2 + geo->numTriangles * 8;
  }
  uVar4 = 0;
  uVar5 = (ulong)(uint)geo->numMorphTargets;
  if (geo->numMorphTargets < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 0x28 - uVar4 != 0; uVar4 = uVar4 + 0x28) {
    uVar2 = uVar2 + 0x18;
    if ((uVar1 >> 0x18 & 1) == 0) {
      if (*(long *)((long)&geo->morphTargets->vertices + uVar4) != 0) {
        uVar2 = uVar2 + geo->numVertices * 0xc;
      }
      if (*(long *)((long)&geo->morphTargets->normals + uVar4) != 0) {
        uVar2 = uVar2 + geo->numVertices * 0xc;
      }
    }
  }
  return uVar2;
}

Assistant:

static uint32
geoStructSize(Geometry *geo)
{
	uint32 size = 0;
	size += sizeof(GeoStreamData);
	if(version < 0x34000)
		size += 12;	// surface properties
	if(!(geo->flags & Geometry::NATIVE)){
		if(geo->flags&geo->PRELIT)
			size += 4*geo->numVertices;
		for(int32 i = 0; i < geo->numTexCoordSets; i++)
			size += 2*geo->numVertices*4;
		size += 4*geo->numTriangles*2;
	}
	for(int32 i = 0; i < geo->numMorphTargets; i++){
		MorphTarget *m = &geo->morphTargets[i];
		size += 4*4 + 2*4; // bounding sphere and bools
		if(!(geo->flags & Geometry::NATIVE)){
			if(m->vertices)
				size += 3*geo->numVertices*4;
			if(m->normals)
				size += 3*geo->numVertices*4;
		}
	}
	return size;
}